

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTryTable
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *labels,
          vector<bool,_std::allocator<bool>_> *isRefs)

{
  long *plVar1;
  _Variant_storage<false,_wasm::Name,_wasm::Err> *this_00;
  Result<wasm::Ok> *pRVar2;
  TryTable *trytable;
  _Variant_storage<false,_wasm::Name,_wasm::Err> *p_Var3;
  MixedArena *this_01;
  ulong size;
  Index *pIVar4;
  Index *pIVar5;
  Name item;
  Name label_00;
  undefined1 local_d8 [8];
  Result<wasm::Name> name;
  Result<wasm::Name> _val;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  uintptr_t local_68;
  Type local_60;
  char *local_58;
  size_t local_50;
  IRBuilder *local_48;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *local_40;
  Result<wasm::Ok> *local_38;
  
  local_68 = (uintptr_t)sig.results.id;
  local_60 = sig.params.id;
  local_58 = label.super_IString.str._M_str;
  local_50 = label.super_IString.str._M_len;
  this_01 = &this->wasm->allocator;
  local_48 = this;
  local_38 = __return_storage_ptr__;
  trytable = (TryTable *)MixedArena::allocSpace(this_01,0x98,8);
  (trytable->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression._id = TryTableId;
  (trytable->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
       (Name *)0x0;
  (trytable->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (trytable->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements
       = 0;
  (trytable->catchTags).allocator = this_01;
  local_40 = &(trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>;
  (trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
       (Name *)0x0;
  (trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0
  ;
  (trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
  allocatedElements = 0;
  (trytable->catchDests).allocator = this_01;
  (trytable->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data = (bool *)0x0;
  (trytable->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements = 0;
  (trytable->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.allocatedElements = 0;
  (trytable->catchRefs).allocator = this_01;
  (trytable->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data =
       (Type *)0x0;
  (trytable->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
  (trytable->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements
       = 0;
  (trytable->sentTypes).allocator = this_01;
  (trytable->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id = local_68
  ;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&trytable->catchTags,tags);
  ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
            ((ArenaVectorBase<ArenaVector<bool>,bool> *)&trytable->catchRefs,isRefs);
  pIVar4 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar5 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  size = (long)pIVar5 - (long)pIVar4 >> 2;
  if ((trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements < size) {
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::reallocate(local_40,size);
    pIVar4 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pIVar5 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pIVar4 != pIVar5) {
    this_00 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)
              ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
    do {
      getLabelName((Result<wasm::Name> *)local_d8,local_48,*pIVar4,false);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)this_00,
                 (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_d8);
      if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
        _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                   name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_,
                   _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
                   super_IString.str._M_len +
                   name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_);
        pRVar2 = local_38;
        plVar1 = (long *)((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(long **)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar1;
        if ((long *)_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ == &local_78) {
          *plVar1 = local_78;
          *(undefined8 *)
           ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_70;
        }
        else {
          *(undefined8 *)
           &(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
               _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_;
          *(long *)((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_78;
        }
        *(undefined8 *)
         ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_80;
        *(__index_type *)
         ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                   ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d8);
        return pRVar2;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                (this_00);
      p_Var3 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)0x0;
      if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var3 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d8;
      }
      item.super_IString.str._M_str = (p_Var3->_M_u)._M_first._M_storage.super_IString.str._M_str;
      item.super_IString.str._M_len = (size_t)local_d8;
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back(local_40,item);
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d8);
      pIVar4 = pIVar4 + 1;
    } while (pIVar4 != pIVar5);
  }
  pRVar2 = local_38;
  label_00.super_IString.str._M_str = local_58;
  label_00.super_IString.str._M_len = local_50;
  visitTryTableStart(local_38,local_48,trytable,label_00,local_60);
  return pRVar2;
}

Assistant:

Result<> IRBuilder::makeTryTable(Name label,
                                 Signature sig,
                                 const std::vector<Name>& tags,
                                 const std::vector<Index>& labels,
                                 const std::vector<bool>& isRefs) {
  auto* trytable = wasm.allocator.alloc<TryTable>();
  trytable->type = sig.results;
  trytable->catchTags.set(tags);
  trytable->catchRefs.set(isRefs);
  trytable->catchDests.reserve(labels.size());
  for (auto label : labels) {
    auto name = getLabelName(label);
    CHECK_ERR(name);
    trytable->catchDests.push_back(*name);
  }
  return visitTryTableStart(trytable, label, sig.params);
}